

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dvrktest.cpp
# Opt level: O3

Result TestAnalogInputs(AmpIO **Board,BasePort *Port)

{
  unsigned_long uVar1;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint index;
  long lVar8;
  Result local_64;
  long local_60;
  
  (*Port->_vptr_BasePort[0x1d])(Port);
  if (NUM_FPGA < 1) {
    local_64 = pass;
  }
  else {
    uVar5 = (ulong)(uint)NUM_CHANNEL_PER_FPGA;
    uVar7 = 0;
    local_60 = 0;
    local_64 = pass;
    iVar6 = NUM_FPGA;
    do {
      if (0 < (int)uVar5) {
        iVar2 = (int)local_60;
        lVar8 = 0;
        do {
          index = (uint)lVar8;
          uVar3 = AmpIO::GetAnalogInput(Board[local_60],index);
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8
          ;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"board ",6);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," pot channel ",0xd);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected=",10);
          uVar1 = POT_TEST_ADC_COUNT[lVar8 + uVar7];
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) =
               *(uint *)(&DAT_00128490 + *(long *)(logfile + -0x18)) & 0xffffffb5 | 8;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"board ",6);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&logfile,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," pot channel ",0xd);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,index);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," - ",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected=",10);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," measured=",10);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          if (ABS((double)(long)(uVar3 - uVar1)) <= 1280.0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," ... \x1b[0;32m[PASS]\x1b[0m",0x16);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"... PASS",8);
LAB_001068b7:
            std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," ... \x1b[1;91m[FAIL]\x1b[0m",0x16);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
            std::ostream::put('\x18');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"... FAIL",8);
            std::ios::widen((char)*(undefined8 *)(logfile + -0x18) + 'x');
            std::ostream::put('x');
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&logfile,"Tolerance=",10);
            poVar4 = std::ostream::_M_insert<unsigned_long>(0x128478);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            local_64 = fail;
            if (ABS((double)(long)((ulong)uVar3 - POT_TEST_ADC_COUNT[lVar8 + (ulong)(iVar2 * 4 ^ 4)]
                                  )) < 1280.0) {
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&std::cout,COLOR_ERROR_abi_cxx11_._M_dataplus._M_p,
                                  COLOR_ERROR_abi_cxx11_._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"(Looks like the 68-pin cable is crossed!)",0x29);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,COLOR_OFF_abi_cxx11_._M_dataplus._M_p,
                                  COLOR_OFF_abi_cxx11_._M_string_length);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
              std::ostream::put((char)poVar4);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&logfile,"Crossed scsi?",0xd);
              local_64 = fatal_fail;
              goto LAB_001068b7;
            }
          }
          lVar8 = lVar8 + 1;
          uVar5 = (ulong)NUM_CHANNEL_PER_FPGA;
          iVar6 = NUM_FPGA;
        } while (lVar8 < (long)uVar5);
      }
      local_60 = local_60 + 1;
      uVar7 = (ulong)((int)uVar7 + 4);
    } while (local_60 < iVar6);
  }
  return local_64;
}

Assistant:

Result TestAnalogInputs(AmpIO **Board, BasePort *Port) {
    Result result = pass;
    Port->ReadAllBoards();
    for (int board_index = 0; board_index < NUM_FPGA; board_index++) {
        for (int channel_index = 0; channel_index < NUM_CHANNEL_PER_FPGA; channel_index++) {
            unsigned long reading = Board[board_index]->GetAnalogInput(channel_index);
            std::cout << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            logfile << std::hex << "board " << board_index << " pot channel " << channel_index << " - "
                        << " expected="
                        << POT_TEST_ADC_COUNT[board_index * 4 + channel_index] << " measured=" << reading;
            if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[board_index * 4 + channel_index]) > POT_TEST_ADC_ERROR_TOLERANCE) {
                std::cout << FAIL << std::endl;
                logfile << "... FAIL" << std::endl;
                logfile << "Tolerance=" << POT_TEST_ADC_ERROR_TOLERANCE << std::endl;
                result = fail;
                // check for swapped cable
                if (std::fabs((long) reading - (long) POT_TEST_ADC_COUNT[(1 ^ board_index)  * 4 + channel_index]) <
                    POT_TEST_ADC_ERROR_TOLERANCE) {
                    std::cout << COLOR_ERROR << "(Looks like the 68-pin cable is crossed!)" << COLOR_OFF
                                << std::endl;
                    logfile << "Crossed scsi?" << std::endl;
                    result = fatal_fail;
                }

            } else {
                std::cout << PASS << std::endl;
                logfile << "... PASS" << std::endl;
            }
        }
    }
    
    return result;
}